

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseAssembler::embedConstPool(BaseAssembler *this,Label *label,ConstPool *pool)

{
  ulong uVar1;
  bool bVar2;
  long in_RDX;
  long in_RSI;
  BaseAssembler *in_RDI;
  StringTmp<512UL> sb;
  uint32_t dataSize;
  uint32_t dataSizeLog2;
  uint8_t *data;
  Error _err_2;
  CodeWriter writer;
  size_t size;
  Error _err_1;
  Error _err;
  StringTmp<512UL> *this_00;
  char *in_stack_fffffffffffffc50;
  String *in_stack_fffffffffffffc58;
  BaseAssembler *in_stack_fffffffffffffc60;
  CodeWriter *in_stack_fffffffffffffc68;
  ConstPool *in_stack_fffffffffffffc70;
  StringTmp<512UL> *this_01;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  uint local_36c;
  StringTmp<512UL> local_358;
  undefined1 auStack_357 [7];
  ulong local_350;
  undefined1 *local_340;
  size_t in_stack_fffffffffffffce0;
  undefined4 local_12c;
  uint local_128;
  uint local_124;
  uint8_t *local_120;
  Error local_114;
  CodeWriter local_110;
  size_t local_108;
  Error local_100;
  Error local_fc;
  long local_f8;
  long local_f0;
  Error local_dc;
  StringTmp<512UL> *local_d8;
  Logger *local_d0;
  undefined1 local_b9;
  StringTmp<512UL> *local_b8;
  StringTmp<512UL> *local_b0;
  Logger *local_a8;
  long local_90;
  long local_88;
  undefined4 *local_80;
  uint *local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  FormatOptions *local_50;
  Environment *local_40;
  StringTmp<512UL> *local_38;
  StringTmp<512UL> *local_30;
  StringTmp<512UL> *local_28;
  StringTmp<512UL> *local_20;
  StringTmp<512UL> *local_18;
  ulong *local_10;
  ulong *local_8;
  
  if ((in_RDI->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    DebugUtils::errored(5);
    local_dc = BaseEmitter::reportError
                         (&in_stack_fffffffffffffc60->super_BaseEmitter,
                          (Error)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                          in_stack_fffffffffffffc50);
  }
  else {
    local_f8 = in_RDX;
    local_f0 = in_RSI;
    bVar2 = BaseEmitter::isLabelValid(&in_RDI->super_BaseEmitter,*(uint32_t *)(in_RSI + 4));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_90 = local_f8;
      local_fc = (*(in_RDI->super_BaseEmitter)._vptr_BaseEmitter[9])
                           (in_RDI,1,*(ulong *)(local_f8 + 0xf8) & 0xffffffff);
      local_dc = local_fc;
      if ((local_fc == 0) &&
         (local_100 = (*(in_RDI->super_BaseEmitter)._vptr_BaseEmitter[6])(in_RDI,local_f0),
         local_dc = local_100, local_100 == 0)) {
        local_88 = local_f8;
        local_108 = *(size_t *)(local_f8 + 0xf0);
        if (local_108 == 0) {
          local_dc = 0;
        }
        else {
          CodeWriter::CodeWriter(&local_110,in_RDI);
          local_114 = CodeWriter::ensureSpace
                                ((CodeWriter *)
                                 CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                                 (BaseAssembler *)in_stack_fffffffffffffc70,
                                 (size_t)in_stack_fffffffffffffc68);
          local_dc = local_114;
          if (local_114 == 0) {
            local_120 = CodeWriter::cursor(&local_110);
            CodeWriter::cursor(&local_110);
            ConstPool::fill(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
            CodeWriter::advance(&local_110,local_108);
            CodeWriter::done(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
            if ((in_RDI->super_BaseEmitter)._logger != (Logger *)0x0) {
              local_60 = local_f8;
              local_8 = &local_68;
              local_10 = &local_70;
              local_128 = 0;
              local_70 = *(ulong *)(local_f8 + 0x100);
              for (uVar1 = local_70; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
                local_128 = local_128 + 1;
              }
              local_12c = 3;
              local_78 = &local_128;
              local_80 = &local_12c;
              local_36c = local_128;
              if (3 < local_128) {
                local_36c = 3;
              }
              local_124 = local_36c;
              this_01 = &local_358;
              local_d8 = this_01;
              local_68 = local_70;
              local_18 = this_01;
              memset(this_01,0,0x20);
              StringTmp<512UL>::_resetToTemporary(this_01);
              local_d0 = (in_RDI->super_BaseEmitter)._logger;
              local_50 = &local_d0->_options;
              local_40 = &(in_RDI->super_BaseEmitter)._environment;
              this_00 = (StringTmp<512UL> *)0x1;
              Formatter::formatData
                        ((String *)CONCAT17(local_40->_arch,in_stack_fffffffffffffc78),
                         (FormatFlags)((ulong)this_01 >> 0x20),(Arch)((ulong)this_01 >> 0x18),
                         (TypeId)((ulong)this_01 >> 0x10),in_stack_fffffffffffffc68,
                         (size_t)in_stack_fffffffffffffc60,in_stack_fffffffffffffce0);
              local_b8 = &local_358;
              local_b9 = 10;
              String::_opChar(in_stack_fffffffffffffc58,
                              (ModifyOp)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                              (char)((ulong)in_stack_fffffffffffffc50 >> 0x18));
              local_a8 = (in_RDI->super_BaseEmitter)._logger;
              local_b0 = &local_358;
              if ((byte)local_358 < 0x1f) {
                local_340 = auStack_357;
                local_350 = (ulong)(byte)local_358;
              }
              local_38 = local_b0;
              local_30 = local_b0;
              local_28 = local_b0;
              local_20 = local_b0;
              (*local_a8->_vptr_Logger[2])(local_a8,local_340,local_350);
              StringTmp<512UL>::~StringTmp(this_00);
            }
            local_dc = 0;
          }
        }
      }
    }
    else {
      DebugUtils::errored(0xc);
      local_dc = BaseEmitter::reportError
                           (&in_stack_fffffffffffffc60->super_BaseEmitter,
                            (Error)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                            in_stack_fffffffffffffc50);
    }
  }
  return local_dc;
}

Assistant:

Error BaseAssembler::embedConstPool(const Label& label, const ConstPool& pool) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (ASMJIT_UNLIKELY(!isLabelValid(label)))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  ASMJIT_PROPAGATE(align(AlignMode::kData, uint32_t(pool.alignment())));
  ASMJIT_PROPAGATE(bind(label));

  size_t size = pool.size();
  if (!size)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, size));

#ifndef ASMJIT_NO_LOGGING
  uint8_t* data = writer.cursor();
#endif

  pool.fill(writer.cursor());
  writer.advance(size);
  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    uint32_t dataSizeLog2 = Support::min<uint32_t>(Support::ctz(pool.minItemSize()), 3);
    uint32_t dataSize = 1 << dataSizeLog2;

    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), dataTypeIdBySize[dataSize], data, size >> dataSizeLog2);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}